

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O0

void gba_system_loop(void)

{
  uint uVar1;
  gba_ppu_t *in_RDI;
  int line_1;
  int line;
  int extra;
  int i_3;
  int ran_3;
  int i_2;
  int ran_2;
  int i_1;
  int ran_1;
  int i;
  int ran;
  gba_ppu_t *in_stack_00000128;
  arm7tdmi_t *in_stack_00000148;
  int in_stack_ffffffffffffffb4;
  int local_48;
  int local_44;
  int local_40;
  int local_38;
  int local_34;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_44 = 0;
  while (((should_quit ^ 0xffU) & 1) != 0) {
    for (local_48 = 0; local_48 < 0xa0; local_48 = local_48 + 1) {
      for (local_14 = local_44 + 0x3c0; 0 < local_14; local_14 = local_14 - local_10) {
        cpu_stepped = false;
        cpu->irq = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
        if (((cpu->halt & 1U) == 0) || ((cpu->irq & 1U) != 0)) {
          cpu_stepped = true;
          local_10 = arm7tdmi_step(in_stack_00000148);
        }
        else {
          local_10 = 1;
        }
        timer_tick(in_stack_ffffffffffffffb4);
        for (local_1c = 0; local_1c < local_10; local_1c = local_1c + 1) {
          uVar1 = apu->apu_cycle_counter + 1;
          apu->apu_cycle_counter = uVar1;
          if (0x15d < uVar1) {
            apu->apu_cycle_counter = 0;
            apu_push_sample(apu);
          }
        }
      }
      ppu_hblank(in_stack_00000128);
      for (local_20 = local_14 + 0x110; 0 < local_20; local_20 = local_20 - local_c) {
        cpu_stepped = false;
        cpu->irq = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
        if (((cpu->halt & 1U) == 0) || ((cpu->irq & 1U) != 0)) {
          cpu_stepped = true;
          local_c = arm7tdmi_step(in_stack_00000148);
        }
        else {
          local_c = 1;
        }
        timer_tick(in_stack_ffffffffffffffb4);
        for (local_28 = 0; local_28 < local_c; local_28 = local_28 + 1) {
          uVar1 = apu->apu_cycle_counter + 1;
          apu->apu_cycle_counter = uVar1;
          if (0x15d < uVar1) {
            apu->apu_cycle_counter = 0;
            apu_push_sample(apu);
          }
        }
      }
      local_44 = local_20;
      ppu_end_hblank((gba_ppu_t *)0x13a561);
    }
    ppu_vblank((gba_ppu_t *)0x13a57d);
    for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < 0x44;
        in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
      for (local_2c = local_44 + 0x3c0; 0 < local_2c; local_2c = local_2c - local_8) {
        cpu_stepped = false;
        cpu->irq = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
        if (((cpu->halt & 1U) == 0) || ((cpu->irq & 1U) != 0)) {
          cpu_stepped = true;
          local_8 = arm7tdmi_step(in_stack_00000148);
        }
        else {
          local_8 = 1;
        }
        timer_tick(in_stack_ffffffffffffffb4);
        for (local_34 = 0; local_34 < local_8; local_34 = local_34 + 1) {
          uVar1 = apu->apu_cycle_counter + 1;
          apu->apu_cycle_counter = uVar1;
          if (0x15d < uVar1) {
            apu->apu_cycle_counter = 0;
            apu_push_sample(apu);
          }
        }
      }
      ppu_hblank(in_stack_00000128);
      for (local_38 = local_2c + 0x110; 0 < local_38; local_38 = local_38 - local_4) {
        cpu_stepped = false;
        cpu->irq = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
        if (((cpu->halt & 1U) == 0) || ((cpu->irq & 1U) != 0)) {
          cpu_stepped = true;
          local_4 = arm7tdmi_step(in_stack_00000148);
        }
        else {
          local_4 = 1;
        }
        timer_tick(in_stack_ffffffffffffffb4);
        for (local_40 = 0; local_40 < local_4; local_40 = local_40 + 1) {
          uVar1 = apu->apu_cycle_counter + 1;
          apu->apu_cycle_counter = uVar1;
          if (0x15d < uVar1) {
            apu->apu_cycle_counter = 0;
            apu_push_sample(apu);
          }
        }
      }
      local_44 = local_38;
      ppu_end_hblank((gba_ppu_t *)0x13a7ce);
    }
    in_RDI = ppu;
    ppu_end_vblank((gba_ppu_t *)0x13a7ea);
    persist_backup();
  }
  cleanup((EVP_PKEY_CTX *)in_RDI);
  return;
}

Assistant:

void gba_system_loop() {
    int extra = 0;
    while (!should_quit) {
        for (int line = 0; line < VISIBLE_LINES; line++) {
            extra = run_system(VISIBLE_CYCLES + extra);
            ppu_hblank(ppu);
            extra = run_system(HBLANK_CYCLES + extra);
            ppu_end_hblank(ppu);
        }
        ppu_vblank(ppu);
        for (int line = 0; line < VBLANK_LINES; line++) {
            extra = run_system(VISIBLE_CYCLES + extra);
            ppu_hblank(ppu);
            extra = run_system(HBLANK_CYCLES + extra);
            ppu_end_hblank(ppu);
        }
        ppu_end_vblank(ppu);
        persist_backup();
    }

    cleanup();
}